

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::CodeGeneratorResponse::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  Nullable<const_char_*> failure_msg;
  Arena *arena;
  CodeGeneratorResponse *_this;
  CodeGeneratorResponse *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (CodeGeneratorResponse *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::compiler::CodeGeneratorResponse_const*,google::protobuf::compiler::CodeGeneratorResponse*>
                          ((CodeGeneratorResponse **)local_20,&local_28,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x6e1,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::MergeFrom
            (&(local_28->field_0)._impl_.file_,
             (RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *)
             &from_msg[1]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      pp_Var2 = from_msg[3]._vptr_MessageLite;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      arena = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.error_,(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
                 arena);
    }
    if ((uVar1 & 2) != 0) {
      *(intptr_t *)((long)&local_28->field_0 + 0x28) = from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 4) != 0) {
      *(undefined4 *)((long)&local_28->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar1 & 8) != 0) {
      (local_28->field_0)._impl_.maximum_edition_ =
           *(int32_t *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
  }
  (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_28->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CodeGeneratorResponse*>(&to_msg);
  auto& from = static_cast<const CodeGeneratorResponse&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_file()->MergeFrom(
      from._internal_file());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_error(from._internal_error());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.supported_features_ = from._impl_.supported_features_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.minimum_edition_ = from._impl_.minimum_edition_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.maximum_edition_ = from._impl_.maximum_edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}